

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O0

void __thiscall DGlow2::Serialize(DGlow2 *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  FSerializer *arc_local;
  DGlow2 *this_local;
  
  DSectorEffect::Serialize((DSectorEffect *)this,arc);
  pFVar1 = FSerializer::operator()(arc,"end",&this->m_End);
  pFVar1 = FSerializer::operator()(pFVar1,"maxtics",&this->m_MaxTics);
  pFVar1 = FSerializer::operator()(pFVar1,"oneshot",&this->m_OneShot);
  pFVar1 = FSerializer::operator()(pFVar1,"start",&this->m_Start);
  FSerializer::operator()(pFVar1,"tics",&this->m_Tics);
  return;
}

Assistant:

void DGlow2::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("end", m_End)
		("maxtics", m_MaxTics)
		("oneshot", m_OneShot)
		("start", m_Start)
		("tics", m_Tics);
}